

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O3

void cmAddLinkDirectoryForTarget(void *arg,char *tgt,char *d)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  cmState *pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  cmTarget *this;
  long *plVar4;
  long *plVar5;
  element_type *peVar6;
  cmState *pcVar7;
  undefined8 uVar8;
  allocator<char> local_ca;
  allocator<char> local_c9;
  string local_c8;
  cmListFileBacktrace local_a8;
  undefined1 local_98 [16];
  undefined8 local_88 [2];
  undefined8 local_78 [2];
  allocator<char> local_68 [16];
  undefined8 local_58;
  element_type *peStack_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,tgt,(allocator<char> *)&local_a8);
  this = cmMakefile::FindLocalNonAliasTarget((cmMakefile *)arg,&local_c8);
  paVar3 = &local_c8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (this != (cmTarget *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,d,local_68);
    cmMakefile::GetBacktrace((cmMakefile *)arg);
    cmTarget::InsertLinkDirectory(this,&local_c8,&local_a8,false);
    if (local_a8.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_38._vptr__Sp_counted_base = (_func_int **)local_c8.field_2._M_allocated_capacity;
    local_48[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p == paVar3) {
      return;
    }
    goto LAB_00241944;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,tgt,&local_c9);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x529f19);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_58 = *plVar5;
    peStack_50 = (element_type *)plVar4[3];
    local_68._0_8_ = &local_58;
  }
  else {
    local_58 = *plVar5;
    local_68._0_8_ = (long *)*plVar4;
  }
  local_68._8_8_ = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)local_68);
  peVar6 = (element_type *)(plVar4 + 2);
  if ((element_type *)*plVar4 == peVar6) {
    local_98._0_8_ = (peVar6->field_0).Bottom.State;
    local_98._8_8_ = plVar4[3];
    local_a8.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_98;
  }
  else {
    local_98._0_8_ = (peVar6->field_0).Bottom.State;
    local_a8.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)*plVar4;
  }
  local_a8.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar4[1];
  *plVar4 = (long)peVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_88,d,&local_ca);
  pcVar2 = (cmState *)
           ((long)&(local_a8.TopEntry.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + local_88[1]);
  pcVar7 = (cmState *)0xf;
  if (local_a8.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_98) {
    pcVar7 = (cmState *)local_98._0_8_;
  }
  if (pcVar7 < pcVar2) {
    uVar8 = (cmState *)0xf;
    if ((undefined8 *)local_88[0] != local_78) {
      uVar8 = local_78[0];
    }
    if ((ulong)uVar8 < pcVar2) goto LAB_0024185f;
    plVar4 = (long *)std::__cxx11::string::replace
                               ((ulong)local_88,0,(char *)0x0,
                                (ulong)local_a8.TopEntry.
                                       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr);
  }
  else {
LAB_0024185f:
    plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_a8,local_88[0]);
  }
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar4 + 2);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar4 == p_Var1) {
    local_c8.field_2._M_allocated_capacity = (size_type)p_Var1->_vptr__Sp_counted_base;
    local_c8.field_2._8_8_ = plVar4[3];
    local_c8._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_c8.field_2._M_allocated_capacity = (size_type)p_Var1->_vptr__Sp_counted_base;
    local_c8._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_c8._M_string_length = plVar4[1];
  *plVar4 = (long)p_Var1;
  plVar4[1] = 0;
  *(undefined1 *)&p_Var1->_vptr__Sp_counted_base = 0;
  cmSystemTools::Error(&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((undefined8 *)local_88[0] != local_78) {
    operator_delete((void *)local_88[0],(ulong)(local_78[0] + 1));
  }
  if (local_a8.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_98) {
    operator_delete(local_a8.TopEntry.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,(ulong)&(((map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                                       *)local_98._0_8_)->_M_t)._M_impl.field_0x1);
  }
  if ((undefined8 *)local_68._0_8_ != &local_58) {
    operator_delete((void *)local_68._0_8_,local_58 + 1);
  }
  if (local_48[0]._M_pi == &local_38) {
    return;
  }
LAB_00241944:
  operator_delete(local_48[0]._M_pi,(long)local_38._vptr__Sp_counted_base + 1);
  return;
}

Assistant:

void CCONV cmAddLinkDirectoryForTarget(void* arg, const char* tgt,
                                       const char* d)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  cmTarget* t = mf->FindLocalNonAliasTarget(tgt);
  if (!t) {
    cmSystemTools::Error(
      "Attempt to add link directories to non-existent target: " +
      std::string(tgt) + " for directory " + std::string(d));
    return;
  }
  t->InsertLinkDirectory(d, mf->GetBacktrace());
}